

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord2.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord2::Decode
          (RectangularVolumeRecord2 *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  RectangularVolumeRecord2 *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x58) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>
                     (local_18,&(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.
                                m_ui32EnvRecTyp);
  pKVar2 = KDataStream::operator>>
                     (pKVar2,&(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.
                              m_ui16Length);
  pKVar2 = KDataStream::operator>>
                     (pKVar2,&(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.
                              m_ui8Index);
  pKVar2 = KDataStream::operator>>
                     (pKVar2,&(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.
                              m_ui8Padding);
  pKVar2 = operator>>(pKVar2,&(this->super_RectangularVolumeRecord1).m_CornerLocation.
                              super_DataTypeBase);
  pKVar2 = operator>>(pKVar2,&(this->super_RectangularVolumeRecord1).m_RecLength.super_DataTypeBase)
  ;
  pKVar2 = operator>>(pKVar2,&(this->m_DDT).super_DataTypeBase);
  pKVar2 = operator>>(pKVar2,&(this->super_RectangularVolumeRecord1).m_Ori.super_DataTypeBase);
  pKVar2 = operator>>(pKVar2,&(this->m_Velocity).super_DataTypeBase);
  pKVar2 = operator>>(pKVar2,&(this->m_AngularVelocity).super_DataTypeBase);
  KDataStream::operator>>(pKVar2,(float *)&this->m_f32Padding);
  return;
}

Assistant:

void RectangularVolumeRecord2::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < RECTANGLE_VOLUME_RECORD_2_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32EnvRecTyp
           >> m_ui16Length
           >> m_ui8Index
           >> m_ui8Padding
           >> KDIS_STREAM m_CornerLocation
           >> KDIS_STREAM m_RecLength
           >> KDIS_STREAM m_DDT
           >> KDIS_STREAM m_Ori
           >> KDIS_STREAM m_Velocity
           >> KDIS_STREAM m_AngularVelocity
           >> m_f32Padding;
}